

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight1.cpp
# Opt level: O3

bool gl_GetLight(int group,Plane *p,ADynamicLight *light,bool checkside,FDynLightData *ldata)

{
  double dVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  float x;
  float fVar10;
  float y;
  float z;
  float fVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float local_4c;
  float local_38;
  float fStack_34;
  
  iVar7 = ((light->super_AActor).Sector)->PortalGroup;
  dVar12 = 0.0;
  uVar13 = 0;
  uVar14 = 0;
  if (iVar7 != group) {
    iVar7 = group * Displacements.size + iVar7;
    dVar12 = Displacements.data.Array[iVar7].pos.X;
    dVar1 = Displacements.data.Array[iVar7].pos.Y;
    uVar13 = SUB84(dVar1,0);
    uVar14 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  x = (float)(dVar12 + (light->super_AActor).__Pos.X);
  y = (float)(light->super_AActor).__Pos.Z;
  z = (float)((double)CONCAT44(uVar14,uVar13) + (light->super_AActor).__Pos.Y);
  fVar10 = Plane::DistToPoint(p,x,y,z);
  if (((light->super_AActor).flags2.Value & 0x10000000) == 0) {
    fVar11 = light->m_currentRadius + light->m_currentRadius;
  }
  else {
    fVar11 = 0.0;
  }
  bVar5 = false;
  if ((0.0 < fVar11) && (bVar5 = false, ABS(fVar10) <= fVar11)) {
    if ((checkside) &&
       ((gl_lights_checkside.Value == true && (bVar5 = Plane::PointOnSide(p,x,y,z), bVar5)))) {
      return false;
    }
    uVar3 = (light->super_AActor).flags4.Value;
    uVar8 = uVar3 & 0x400;
    fStack_34 = *(float *)(&DAT_0074e7f4 + (ulong)(uVar8 == 0) * 4);
    uVar2 = *(undefined8 *)(light->super_AActor).args;
    local_4c = (float)(byte)(light->super_AActor).args[2] * fStack_34;
    local_38 = fStack_34 * (float)((uint)uVar2 & 0xff);
    fStack_34 = fStack_34 * (float)((uint)((ulong)uVar2 >> 0x20) & 0xff);
    if ((uVar3 >> 0xb & 1) == 0) {
      uVar8 = uVar8 >> 9;
    }
    else {
      fVar10 = SQRT(local_4c * local_4c + fStack_34 * fStack_34 + local_38 * local_38);
      local_38 = fVar10 - local_38;
      fStack_34 = fVar10 - fStack_34;
      local_4c = fVar10 - local_4c;
      uVar8 = 1;
    }
    uVar9 = (ulong)(uVar8 << 4);
    TArray<float,_float>::Grow((TArray<float,_float> *)((long)&ldata->arrays[0].Array + uVar9),8);
    uVar3 = *(uint *)((long)&ldata->arrays[0].Count + uVar9);
    uVar6 = (ulong)uVar3;
    *(uint *)((long)&ldata->arrays[0].Count + uVar9) = uVar3 + 8;
    lVar4 = *(long *)((long)&ldata->arrays[0].Array + uVar9);
    *(float *)(lVar4 + uVar6 * 4) = x;
    *(float *)(lVar4 + 4 + uVar6 * 4) = y;
    *(float *)(lVar4 + 8 + uVar6 * 4) = z;
    *(float *)(lVar4 + 0xc + uVar6 * 4) = fVar11;
    *(ulong *)(lVar4 + 0x10 + uVar6 * 4) = CONCAT44(fStack_34,local_38);
    *(float *)(lVar4 + 0x18 + uVar6 * 4) = local_4c;
    *(undefined4 *)(lVar4 + 0x1c + uVar6 * 4) = 0;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool gl_GetLight(int group, Plane & p, ADynamicLight * light, bool checkside, FDynLightData &ldata)
{
	int i = 0;

	DVector3 pos = light->PosRelative(group);
	
	float dist = fabsf(p.DistToPoint(pos.X, pos.Z, pos.Y));
	float radius = (light->GetRadius());
	
	if (radius <= 0.f) return false;
	if (dist > radius) return false;
	if (checkside && gl_lights_checkside && p.PointOnSide(pos.X, pos.Z, pos.Y))
	{
		return false;
	}


	float cs;
	if (light->IsAdditive()) 
	{
		cs = 0.2f;
		i = 2;
	}
	else 
	{
		cs = 1.0f;
	}

	float r = light->GetRed() / 255.0f * cs;
	float g = light->GetGreen() / 255.0f * cs;
	float b = light->GetBlue() / 255.0f * cs;

	if (light->IsSubtractive())
	{
		Vector v;
		
		v.Set(r, g, b);
		r = v.Length() - r;
		g = v.Length() - g;
		b = v.Length() - b;
		i = 1;
	}

	float *data = &ldata.arrays[i][ldata.arrays[i].Reserve(8)];
	data[0] = pos.X;
	data[1] = pos.Z;
	data[2] = pos.Y;
	data[3] = radius;
	data[4] = r;
	data[5] = g;
	data[6] = b;
	data[7] = 0;
	return true;
}